

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cursor.c
# Opt level: O3

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  long lVar1;
  char *pcVar2;
  bool bVar3;
  double dVar4;
  
  if (action == 1) {
    if (key == 0x54) {
      bVar3 = delay == 0;
      delay = (int)bVar3;
      pcVar2 = "disabled";
      if (bVar3) {
        pcVar2 = "enabled";
      }
      printf("Delay %s.\n",pcVar2);
      return;
    }
    if (key == 0x100) {
      glfwSetWindowShouldClose(window,1);
      return;
    }
    if (delay == 0) {
      command_callback(key);
      return;
    }
    lVar1 = 0;
    do {
      if (*(int *)((long)&commands[0].key + lVar1) == key) {
        dVar4 = glfwGetTime();
        *(double *)((long)&commands[0].time + lVar1) = dVar4;
        return;
      }
      lVar1 = lVar1 + 0x10;
    } while (lVar1 != 0x80);
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_ESCAPE:
            glfwSetWindowShouldClose(window, GL_TRUE);
            break;

        case GLFW_KEY_T:
            delay = !delay;
            printf("Delay %s.\n", delay ? "enabled" : "disabled");
            break;

        default:
        {
            if (delay)
            {
                int i = 0;

                while (i < CommandCount && commands[i].key != key)
                    i++;

                if (i < CommandCount)
                    commands[i].time = glfwGetTime();
            }
            else
            {
                command_callback(key);
            }
        }
        break;
    }
}